

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O3

int __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>::DLPSV>
::remove(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>::DLPSV>
         *this,char *__filename)

{
  uint uVar1;
  Item *pIVar2;
  DataKey *pDVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  
  iVar4 = this->thenum;
  if (0 < iVar4) {
    pIVar2 = this->theitem;
    pDVar3 = this->thekey;
    lVar7 = 0;
    uVar5 = 0xffffffff;
    iVar8 = 0;
    do {
      if (*(int *)(__filename + lVar7 * 4) < 0) {
        uVar1 = pDVar3[lVar7].idx;
        pIVar2[(int)uVar1].info = this->firstfree;
        this->firstfree = ~uVar1;
        if ((int)uVar5 < 0) {
          uVar5 = (uint)lVar7;
        }
      }
      else {
        *(int *)(__filename + lVar7 * 4) = iVar8;
        iVar8 = iVar8 + 1;
        iVar4 = this->thenum;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
    if ((int)uVar5 < iVar4 && -1 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
      do {
        if ((long)*(int *)(__filename + uVar6 * 4) < 0) {
          this->thenum = this->thenum + -1;
        }
        else {
          this->thekey[*(int *)(__filename + uVar6 * 4)] = this->thekey[uVar6];
          pDVar3 = this->thekey;
          this->theitem[pDVar3[uVar6].idx].info = *(int *)(__filename + uVar6 * 4);
          pDVar3[uVar6].idx = -1;
        }
        uVar6 = uVar6 + 1;
      } while ((int)uVar6 < iVar4);
    }
  }
  return iVar4;
}

Assistant:

int num() const
   {
      return thenum;
   }